

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixTone.cpp
# Opt level: O2

BOOL MakePixelWaveData(PIXTONEPARAMETER *ptp,uchar *pData)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  char envelopeTable [256];
  
  MakeWaveTables();
  uVar8 = 0;
  memset(envelopeTable,0,0x100);
  dVar10 = (double)ptp->initial;
  uVar2 = ptp->pointAx;
  uVar5 = 0;
  dVar12 = dVar10;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  for (; uVar5 != uVar8; uVar8 = uVar8 + 1) {
    envelopeTable[uVar8] = (char)(int)dVar12;
    dVar12 = dVar12 + ((double)ptp->pointAy - dVar10) / (double)(int)uVar2;
  }
  iVar7 = ptp->pointAy;
  iVar3 = ptp->pointBx;
  dVar12 = (double)iVar7;
  for (; (long)uVar5 < (long)iVar3; uVar5 = uVar5 + 1) {
    envelopeTable[uVar5] = (char)(int)dVar12;
    dVar12 = dVar12 + ((double)ptp->pointBy - (double)iVar7) / (double)(int)(iVar3 - uVar2);
  }
  iVar7 = ptp->pointBy;
  iVar4 = ptp->pointCx;
  dVar12 = (double)iVar7;
  for (; (long)uVar5 < (long)iVar4; uVar5 = uVar5 + 1) {
    envelopeTable[uVar5] = (char)(int)dVar12;
    dVar12 = dVar12 + ((double)ptp->pointCy - (double)iVar7) / (double)(iVar4 - iVar3);
  }
  dVar12 = (double)ptp->pointCy;
  dVar10 = dVar12 / (double)(0x100 - iVar4);
  pcVar6 = envelopeTable + uVar5;
  for (; uVar5 < 0x100; uVar5 = uVar5 + 1) {
    *pcVar6 = (char)(int)dVar12;
    dVar12 = dVar12 - dVar10;
    pcVar6 = pcVar6 + 1;
  }
  dVar12 = (ptp->oMain).num;
  dVar10 = 0.0;
  dVar11 = 0.0;
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    dVar11 = 256.0 / ((double)ptp->size / dVar12);
  }
  dVar12 = (ptp->oPitch).num;
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    dVar10 = 256.0 / ((double)ptp->size / dVar12);
  }
  dVar12 = (ptp->oVolume).num;
  dVar13 = 0.0;
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    dVar13 = 256.0 / ((double)ptp->size / dVar12);
  }
  dVar12 = (double)(ptp->oPitch).offset;
  dVar14 = (double)(ptp->oMain).offset;
  dVar15 = (double)(ptp->oVolume).offset;
  iVar7 = 0;
  for (lVar9 = 0; lVar9 < ptp->size; lVar9 = lVar9 + 1) {
    pData[lVar9] = (char)(((((((int)gWaveModelTable[(ptp->oVolume).model][(int)dVar15 % 0x100] *
                              (ptp->oVolume).top) / 0x40 + 0x40) *
                            (((int)gWaveModelTable[(ptp->oMain).model][(int)dVar14 % 0x100] *
                             (ptp->oMain).top) / 0x40)) / 0x40) *
                          (int)envelopeTable[(int)((double)iVar7 / (double)ptp->size)]) / 0x40) +
                   0x80;
    cVar1 = gWaveModelTable[(ptp->oPitch).model][(int)dVar12 % 0x100];
    if (cVar1 < '\0') {
      dVar16 = dVar11 - (double)(ptp->oPitch).top * (double)-(int)cVar1 * dVar11 * 0.5 * 0.015625 *
                        0.015625;
    }
    else {
      dVar16 = (double)(ptp->oPitch).top * (double)(int)cVar1 * (dVar11 + dVar11) * 0.015625 *
               0.015625 + dVar11;
    }
    dVar14 = dVar14 + dVar16;
    dVar12 = dVar12 + dVar10;
    dVar15 = dVar15 + dVar13;
    iVar7 = iVar7 + 0x100;
  }
  return true;
}

Assistant:

BOOL MakePixelWaveData(const PIXTONEPARAMETER *ptp, unsigned char *pData)
{
	int i;
	int a, b, c, d;

	double dPitch;
	double dMain;
	double dVolume;

	double dEnvelope;
	signed char envelopeTable[0x100];

	double d1, d2, d3;

	// The Linux port added a cute optimisation here, where MakeWaveTables is only called once during the game's execution
	//if (wave_tables_made != TRUE)
	//{
		MakeWaveTables();
	//	wave_tables_made = TRUE;
	//}

	memset(envelopeTable, 0, sizeof(envelopeTable));

	i = 0;

	dEnvelope = ptp->initial;
	while (i < ptp->pointAx)
	{
		envelopeTable[i] = (signed char)dEnvelope;
		dEnvelope = (((double)ptp->pointAy - ptp->initial) / ptp->pointAx) + dEnvelope;
		++i;
	}

	dEnvelope = ptp->pointAy;
	while (i < ptp->pointBx)
	{
		envelopeTable[i] = (signed char)dEnvelope;
		dEnvelope = (((double)ptp->pointBy - ptp->pointAy) / (double)(ptp->pointBx - ptp->pointAx)) + dEnvelope;
		++i;
	}

	dEnvelope = ptp->pointBy;
	while (i < ptp->pointCx)
	{
		envelopeTable[i] = (signed char)dEnvelope;
		dEnvelope = ((double)ptp->pointCy - ptp->pointBy) / (double)(ptp->pointCx - ptp->pointBx) + dEnvelope;
		++i;
	}

	dEnvelope = ptp->pointCy;
	while (i < 0x100)
	{
		envelopeTable[i] = (signed char)dEnvelope;
		dEnvelope = dEnvelope - (ptp->pointCy / (double)(0x100 - ptp->pointCx));
		++i;
	}

	dPitch = ptp->oPitch.offset;
	dMain = ptp->oMain.offset;
	dVolume = ptp->oVolume.offset;

	if (ptp->oMain.num == 0.0)
		d1 = 0.0;
	else
		d1 = 256.0 / (ptp->size / ptp->oMain.num);

	if (ptp->oPitch.num == 0.0)
		d2 = 0.0;
	else
		d2 = 256.0 / (ptp->size / ptp->oPitch.num);

	if (ptp->oVolume.num == 0.0)
		d3 = 0.0;
	else
		d3 = 256.0 / (ptp->size / ptp->oVolume.num);

	for (i = 0; i < ptp->size; ++i)
	{
		a = (int)dMain % 0x100;
		b = (int)dPitch % 0x100;
		c = (int)dVolume % 0x100;
		d = (int)((double)(i * 0x100) / ptp->size);
		pData[i] = gWaveModelTable[ptp->oMain.model][a]
		         * ptp->oMain.top
		         / 64
		         * (((gWaveModelTable[ptp->oVolume.model][c] * ptp->oVolume.top) / 64) + 64)
		         / 64
		         * envelopeTable[d]
		         / 64
		         + 128;

		if (gWaveModelTable[ptp->oPitch.model][b] < 0)
			dMain = d1 - d1 * 0.5 * -gWaveModelTable[ptp->oPitch.model][b] * ptp->oPitch.top / 64.0 / 64.0 + dMain;
		else
			dMain = d1 + d1 * 2.0 * gWaveModelTable[ptp->oPitch.model][b] * ptp->oPitch.top / 64.0 / 64.0 + dMain;

		dPitch = dPitch + d2;
		dVolume = dVolume + d3;
	}

	return TRUE;
}